

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

shaderDefinition * __thiscall
glcts::TextureCubeMapArraySamplingTest::programDefinition::getShader
          (programDefinition *this,shaderType shader_type)

{
  shaderType shader_type_local;
  programDefinition *this_local;
  
  switch(shader_type) {
  case Compute:
    this_local = (programDefinition *)this->compute_shader;
    break;
  case Fragment:
    this_local = (programDefinition *)this->fragment_shader;
    break;
  case Geometry:
    this_local = (programDefinition *)this->geometry_shader;
    break;
  case Tesselation_Control:
    this_local = (programDefinition *)this->tesselation_control_shader;
    break;
  case Tesselation_Evaluation:
    this_local = (programDefinition *)this->tesselation_evaluation_shader;
    break;
  case Vertex:
    this_local = (programDefinition *)this->vertex_shader;
    break;
  default:
    this_local = (programDefinition *)0x0;
  }
  return (shaderDefinition *)this_local;
}

Assistant:

const TextureCubeMapArraySamplingTest::shaderDefinition* TextureCubeMapArraySamplingTest::programDefinition::getShader(
	shaderType shader_type) const
{
	switch (shader_type)
	{
	case Compute:
		return compute_shader;
		break;
	case Fragment:
		return fragment_shader;
		break;
	case Geometry:
		return geometry_shader;
		break;
	case Tesselation_Control:
		return tesselation_control_shader;
		break;
	case Tesselation_Evaluation:
		return tesselation_evaluation_shader;
		break;
	case Vertex:
		return vertex_shader;
		break;
	}

	return 0;
}